

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O1

REF_STATUS ref_grid_faceid_range(REF_GRID ref_grid,REF_INT *min_faceid,REF_INT *max_faceid)

{
  REF_CELL pRVar1;
  bool bVar2;
  REF_MPI ref_mpi;
  REF_STATUS RVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  REF_INT RVar7;
  REF_INT global;
  REF_INT nodes [27];
  REF_INT local_b4;
  REF_MPI local_b0;
  REF_INT local_a8 [30];
  
  local_b0 = ref_grid->mpi;
  *min_faceid = 0x7fffffff;
  *max_faceid = -0x80000000;
  pRVar1 = ref_grid->cell[3];
  if (0 < pRVar1->max) {
    RVar7 = 0;
    do {
      RVar3 = ref_cell_nodes(pRVar1,RVar7,local_a8);
      if (RVar3 == 0) {
        iVar6 = local_a8[pRVar1->node_per];
        if (*min_faceid < local_a8[pRVar1->node_per]) {
          iVar6 = *min_faceid;
        }
        *min_faceid = iVar6;
        iVar6 = local_a8[pRVar1->node_per];
        if (local_a8[pRVar1->node_per] < *max_faceid) {
          iVar6 = *max_faceid;
        }
        *max_faceid = iVar6;
      }
      RVar7 = RVar7 + 1;
    } while (RVar7 < pRVar1->max);
  }
  pRVar1 = ref_grid->cell[6];
  if (0 < pRVar1->max) {
    RVar7 = 0;
    do {
      RVar3 = ref_cell_nodes(pRVar1,RVar7,local_a8);
      if (RVar3 == 0) {
        iVar6 = local_a8[pRVar1->node_per];
        if (*min_faceid < local_a8[pRVar1->node_per]) {
          iVar6 = *min_faceid;
        }
        *min_faceid = iVar6;
        iVar6 = local_a8[pRVar1->node_per];
        if (local_a8[pRVar1->node_per] < *max_faceid) {
          iVar6 = *max_faceid;
        }
        *max_faceid = iVar6;
      }
      RVar7 = RVar7 + 1;
    } while (RVar7 < pRVar1->max);
  }
  ref_mpi = local_b0;
  if (local_b0->n < 2) {
    return 0;
  }
  uVar4 = ref_mpi_min(local_b0,min_faceid,&local_b4,1);
  if (uVar4 == 0) {
    uVar5 = ref_mpi_bcast(ref_mpi,&local_b4,1,1);
    if (uVar5 == 0) {
      *min_faceid = local_b4;
      uVar5 = ref_mpi_max(ref_mpi,max_faceid,&local_b4,1);
      if (uVar5 == 0) {
        uVar5 = ref_mpi_bcast(ref_mpi,&local_b4,1,1);
        if (uVar5 == 0) {
          *max_faceid = local_b4;
          bVar2 = true;
          goto LAB_0014cf25;
        }
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
               0x179,"ref_grid_faceid_range",(ulong)uVar5,"mpi max face");
        uVar4 = uVar5;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
               0x178,"ref_grid_faceid_range",(ulong)uVar5,"mpi max face");
        uVar4 = uVar5;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x174,
             "ref_grid_faceid_range",(ulong)uVar5,"mpi min face");
      uVar4 = uVar5;
    }
    bVar2 = false;
  }
  else {
    bVar2 = false;
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x173,
           "ref_grid_faceid_range",(ulong)uVar4,"mpi min face");
  }
LAB_0014cf25:
  if (bVar2) {
    return 0;
  }
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_grid_faceid_range(REF_GRID ref_grid, REF_INT *min_faceid,
                                         REF_INT *max_faceid) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_CELL ref_cell;
  REF_INT cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];

  *min_faceid = REF_INT_MAX;
  *max_faceid = REF_INT_MIN;

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    *min_faceid = MIN(*min_faceid, nodes[ref_cell_node_per(ref_cell)]);
    *max_faceid = MAX(*max_faceid, nodes[ref_cell_node_per(ref_cell)]);
  }